

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

void __thiscall test_rope::initialize_tensors(test_rope *this,ggml_context *ctx)

{
  int iVar1;
  ggml_tensor *tensor;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float min;
  float max;
  allocator_type local_51;
  ggml_context *local_50;
  vector<int,_std::allocator<int>_> data;
  
  tensor = (ggml_tensor *)ggml_get_first_tensor(ctx);
  local_50 = ctx;
  for (; tensor != (ggml_tensor *)0x0; tensor = (ggml_tensor *)ggml_get_next_tensor(ctx,tensor)) {
    if (tensor->type == GGML_TYPE_I32) {
      uVar2 = (this->ne_a)._M_elems[2] << ((byte)this->mode >> 2 & 2);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &data.super__Vector_base<int,_std::allocator<int>_>,(long)(int)uVar2,&local_51);
      uVar3 = uVar2 & 0xffffffff;
      if ((int)uVar2 < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        iVar1 = rand();
        data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar4] = iVar1 % this->n_ctx;
      }
      ggml_backend_tensor_set
                (tensor,data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,0,(long)(uVar2 << 0x20) >> 0x1e);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&data.super__Vector_base<int,_std::allocator<int>_>);
      ctx = local_50;
    }
    else {
      if (tensor->ne[0] == (long)(this->n_dims / 2)) {
        min = 0.9;
        max = 1.1;
      }
      else {
        min = -1.0;
        max = 1.0;
      }
      init_tensor_uniform(tensor,min,max);
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // pos
                const int num_pos_ids = (mode & GGML_ROPE_TYPE_MROPE) ? ne_a[2] * 4 : ne_a[2];
                std::vector<int> data(num_pos_ids);
                for (int i = 0; i < num_pos_ids; i++) {
                    data[i] = rand() % n_ctx;
                }
                ggml_backend_tensor_set(t, data.data(), 0, num_pos_ids * sizeof(int));
            } else {
                if (t->ne[0] == n_dims/2) {
                    // frequency factors in the range [0.9f, 1.1f]
                    init_tensor_uniform(t, 0.9f, 1.1f);
                } else {
                    init_tensor_uniform(t);
                }
            }
        }
    }